

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O0

double Jupiter_strtod_nospace(char *str)

{
  uchar *puVar1;
  int iVar2;
  double dVar3;
  int local_34;
  int tval;
  double decimal;
  double total;
  uchar *puStack_18;
  int base;
  char *str_local;
  
  decimal = 0.0;
  if (*str == '-') {
    dVar3 = Jupiter_strtod_nospace(str + 1);
    str_local = (char *)(dVar3 * -1.0);
  }
  else {
    puStack_18 = (uchar *)str;
    if (*str == '+') {
      puStack_18 = (uchar *)(str + 1);
    }
    while (iVar2 = Jupiter_getBase(*puStack_18,10), iVar2 != -1) {
      decimal = decimal * 10.0 + (double)iVar2;
      puStack_18 = puStack_18 + 1;
    }
    if (*puStack_18 == '.') {
      local_34 = 10;
      puVar1 = puStack_18;
      while( true ) {
        puStack_18 = puVar1 + 1;
        iVar2 = Jupiter_getBase(*puStack_18,10);
        dVar3 = (double)iVar2;
        if ((dVar3 == -1.0) && (!NAN(dVar3))) break;
        decimal = decimal + dVar3 / (double)local_34;
        local_34 = local_34 * 10;
        puVar1 = puStack_18;
      }
      if ((*puStack_18 == 'e') || (*puStack_18 == 'E')) {
        iVar2 = Jupiter_strtoi_nospace((char *)(puVar1 + 2),10);
        dVar3 = pow(10.0,(double)iVar2);
        decimal = decimal * dVar3;
      }
    }
    str_local = (char *)decimal;
  }
  return (double)str_local;
}

Assistant:

double Jupiter_strtod_nospace(const char *str)
{
	const int base = 10;
	double total = 0.0;
	double decimal = 0.0;
	int tval;

	if (*str == '-')
		return -1 * Jupiter_strtod_nospace(++str);

	if (*str == '+')
		++str;

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		++str;
	}

	if (*str == '.')
	{
		++str;
		tval = base;
		while ((decimal = Jupiter_getBase(*str, base)) != -1)
		{
			total = total + (decimal / tval);
			++str;
			tval = tval * base;
		}
		if (*str == 'e' || *str == 'E')
			total = total * pow(base, Jupiter_strtoi_nospace(++str, 10));
	}

	return total;
}